

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O3

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  _Rb_tree_header *p_Var1;
  byte *pbVar2;
  _Alloc_hider _Var3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  _Alloc_hider _Var7;
  const_iterator cVar8;
  const_iterator cVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 extraout_RAX;
  undefined1 __k [8];
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ostream *poVar15;
  string local_128;
  CodeLocation local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  _Base_ptr local_d8;
  char *local_d0;
  internal *local_c8;
  stringstream *local_c0;
  undefined1 auStack_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  undefined1 local_98 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,file,(allocator<char> *)&local_50);
  paVar14 = &local_108.file.field_2;
  local_108.file._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,local_98,(char *)((long)local_98 + tests._M_t._M_impl._0_8_));
  local_108.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.file._M_dataplus._M_p != paVar14) {
    operator_delete(local_108.file._M_dataplus._M_p,local_108.file.field_2._M_allocated_capacity + 1
                   );
  }
  p_Var1 = &tests._M_t._M_impl.super__Rb_tree_header;
  local_c8 = (internal *)file;
  tests._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = line;
  if (local_98 != (undefined1  [8])p_Var1) {
    operator_delete((void *)local_98,tests._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  *this = (TypedTestSuitePState)0x1;
  auStack_b8 = (undefined1  [8])0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar13 = registered_tests + -1;
  local_d0 = registered_tests;
  do {
    pbVar2 = (byte *)(pcVar13 + 1);
    pcVar13 = pcVar13 + 1;
    iVar4 = isspace((uint)*pbVar2);
  } while (iVar4 != 0);
  do {
    pcVar5 = strchr(pcVar13,0x2c);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (pcVar5 == (char *)0x0) {
      sVar6 = strlen(pcVar13);
      pcVar5 = pcVar13 + sVar6;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar13,pcVar5);
    _Var7._M_p = local_50._M_dataplus._M_p;
    if (local_50._M_string_length != 0) {
      pcVar5 = local_50._M_dataplus._M_p + local_50._M_string_length;
      do {
        _Var3._M_p = local_50._M_dataplus._M_p;
        iVar4 = isspace((uint)(byte)pcVar5[-1]);
        _Var7._M_p = _Var3._M_p;
        if (iVar4 == 0) break;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar5 + -1);
        uVar11 = (long)paVar14 - (long)_Var3._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_50,uVar11);
        pcVar5 = local_50._M_dataplus._M_p + uVar11;
        _Var7._M_p = local_50._M_dataplus._M_p;
      } while (paVar14 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var3._M_p);
    }
    paVar14 = &local_50.field_2;
    local_98 = (undefined1  [8])_Var7._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p == paVar14) {
      tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_50.field_2._8_8_;
      local_98 = (undefined1  [8])p_Var1;
    }
    tests._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ =
         local_50.field_2._M_allocated_capacity._1_7_;
    tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
         local_50.field_2._M_local_buf[0];
    tests._M_t._M_impl._0_8_ = local_50._M_string_length;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar14;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    if (local_98 != (undefined1  [8])p_Var1) {
      operator_delete((void *)local_98,tests._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    pcVar13 = strchr(pcVar13,0x2c);
    if (pcVar13 == (char *)0x0) break;
    do {
      pbVar2 = (byte *)(pcVar13 + 1);
      pcVar13 = pcVar13 + 1;
      iVar4 = isspace((uint)*pbVar2);
    } while (iVar4 != 0);
  } while( true );
  Message::Message((Message *)&local_58);
  tests._M_t._M_impl._0_8_ = tests._M_t._M_impl._0_8_ & 0xffffffff00000000;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tests;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&tests;
  if (auStack_b8 !=
      (undefined1  [8])
      name_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c0 = local_58._M_head_impl;
    poVar15 = (ostream *)(local_58._M_head_impl + 0x10);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this + 8);
    local_d8 = (_Base_ptr)(this + 0x10);
    __k = auStack_b8;
    local_e0 = paVar14;
    do {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98,(key_type *)__k);
      if (cVar8._M_node == (_Base_ptr)&tests) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                        *)local_e0->_M_local_buf,(key_type *)__k);
        if (cVar9._M_node == local_d8) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"No test named ",0xe);
          lVar12 = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,(((key_type *)__k)->_M_dataplus)._M_p,
                     ((key_type *)__k)->_M_string_length);
          pcVar13 = " can be found in this test suite.\n";
          goto LAB_00116fa9;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Test ",5);
        lVar12 = 0x1b;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,(((key_type *)__k)->_M_dataplus)._M_p,((key_type *)__k)->_M_string_length
                  );
        pcVar13 = " is listed more than once.\n";
LAB_00116fa9:
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar13,lVar12);
      }
      __k = (undefined1  [8])((long)__k + 0x20);
    } while (__k != (undefined1  [8])
                    name_vec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar4 = (int)paVar14;
  p_Var10 = *(_Rb_tree_node_base **)(this + 0x20);
  if (p_Var10 != (_Rb_tree_node_base *)(this + 0x10)) {
    do {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98,(key_type *)(p_Var10 + 1));
      if (cVar8._M_node == (_Base_ptr)&tests) {
        poVar15 = (ostream *)(local_58._M_head_impl + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,".\n",2);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      iVar4 = (int)paVar14;
    } while (p_Var10 != (_Rb_tree_node_base *)(this + 0x10));
  }
  StringStreamToString(&local_50,local_58._M_head_impl);
  pcVar13 = local_d0;
  if (local_50._M_string_length != 0) {
    FormatFileLocation_abi_cxx11_
              (&local_128,local_c8,
               (char *)(ulong)tests._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,iVar4);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    if (local_58._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))(local_58._M_head_impl);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_b8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  if (local_58._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))(local_58._M_head_impl);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_b8);
  return pcVar13;
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    if (registered_tests_.count(name) != 0) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end(); ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (!errors_str.empty()) {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}